

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int StringReplace(SyBlob *pWorker,sxu32 nOfft,int nLen,char *zReplace,int nReplen)

{
  uint uVar1;
  void *pvVar2;
  sxi32 sVar3;
  int local_4c;
  sxu32 INLEN;
  sxi32 rc;
  sxi32 iRep;
  sxu32 m;
  sxu32 n;
  char *zInput;
  char *pcStack_28;
  int nReplen_local;
  char *zReplace_local;
  int nLen_local;
  sxu32 nOfft_local;
  SyBlob *pWorker_local;
  
  pvVar2 = pWorker->pBlob;
  uVar1 = pWorker->nByte;
  for (rc = nOfft; (uint)(rc + nLen) < uVar1; rc = rc + 1) {
    *(undefined1 *)((long)pvVar2 + (ulong)(uint)rc) =
         *(undefined1 *)((long)pvVar2 + (ulong)(uint)(rc + nLen));
  }
  pWorker->nByte = pWorker->nByte - nLen;
  if ((0 < nReplen) && (sVar3 = SyBlobAppend(pWorker,(void *)0x0,nReplen), sVar3 == 0)) {
    pvVar2 = pWorker->pBlob;
    iRep = pWorker->nByte;
    local_4c = iRep - nOfft;
    while( true ) {
      if (iRep != 0) {
        iRep = iRep + -1;
      }
      INLEN = nReplen;
      pcStack_28 = zReplace;
      zReplace_local._4_4_ = nOfft;
      if (local_4c == 0) break;
      *(undefined1 *)((long)pvVar2 + (ulong)(uint)(iRep + nReplen)) =
           *(undefined1 *)((long)pvVar2 + (ulong)(uint)iRep);
      local_4c = local_4c + -1;
    }
    for (; 0 < (int)INLEN; INLEN = INLEN - 1) {
      *(char *)((long)pvVar2 + (ulong)zReplace_local._4_4_) = *pcStack_28;
      zReplace_local._4_4_ = zReplace_local._4_4_ + 1;
      pcStack_28 = pcStack_28 + 1;
    }
    pWorker->nByte = nReplen + pWorker->nByte;
  }
  return 0;
}

Assistant:

static int StringReplace(SyBlob *pWorker, sxu32 nOfft, int nLen, const char *zReplace, int nReplen)
{
	char *zInput = (char *)SyBlobData(pWorker);
	sxu32 n, m;
	n = SyBlobLength(pWorker);
	m = nOfft;
	/* Delete the old entry */
	STRDEL(zInput, n, m, nLen);
	SyBlobLength(pWorker) -= nLen;
	if( nReplen > 0 ){
		sxi32 iRep = nReplen;
		sxi32 rc;
		/*
		 * Make sure the working buffer is big enough to hold the replacement
		 * string.
		 */
		rc = SyBlobAppend(pWorker, 0/* Grow without an append operation*/, (sxu32)nReplen);
		if( rc != SXRET_OK ){
			/* Simply ignore any memory failure problem */
			return SXRET_OK;
		}
		/* Perform the insertion now */
		zInput = (char *)SyBlobData(pWorker);
		n = SyBlobLength(pWorker);
		SHIFTRANDINSERT(zInput, n, nOfft, zReplace, iRep);
		SyBlobLength(pWorker) += nReplen;
	}	
	return SXRET_OK;
}